

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::SubdivPatch1IntersectorK<4>,_true>::occluded
               (vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  BVH *bvh;
  NodeRef root;
  ulong uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  GridSOA *pGVar23;
  uint uVar24;
  int iVar25;
  undefined4 uVar26;
  ulong uVar27;
  size_t sVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  uint uVar32;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar33;
  char *pcVar34;
  ulong uVar35;
  NodeRef *pNVar36;
  bool bVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar65;
  float fVar66;
  float fVar67;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  float fVar68;
  undefined8 extraout_XMM1_Qa;
  float fVar91;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar88;
  float fVar93;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar89;
  float fVar94;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar90;
  float fVar92;
  float fVar95;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 extraout_var_00 [56];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar124;
  undefined1 auVar114 [16];
  float fVar125;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar136;
  float fVar149;
  float fVar150;
  undefined1 auVar137 [16];
  float fVar151;
  undefined1 auVar138 [16];
  float fVar152;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar153;
  float fVar166;
  float fVar168;
  undefined1 auVar154 [16];
  float fVar169;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar167;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar170;
  float fVar177;
  float fVar178;
  undefined1 auVar171 [16];
  float fVar179;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar180;
  float fVar181;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar195;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar209;
  undefined1 auVar202 [16];
  float fVar210;
  undefined1 auVar213 [16];
  float fVar211;
  float fVar212;
  float fVar219;
  float fVar221;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar218;
  float fVar220;
  undefined1 auVar217 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  float fVar224;
  float fVar228;
  float fVar229;
  undefined1 auVar225 [16];
  float fVar230;
  undefined1 auVar227 [64];
  float fVar231;
  undefined1 auVar232 [16];
  float fVar237;
  undefined1 auVar233 [16];
  float fVar235;
  float fVar236;
  undefined1 auVar234 [64];
  float fVar238;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar245;
  undefined1 auVar241 [16];
  float fVar243;
  float fVar244;
  undefined1 in_ZMM14 [64];
  undefined1 auVar242 [64];
  float fVar246;
  undefined1 auVar247 [16];
  undefined1 auVar248 [64];
  undefined1 local_1b58 [16];
  undefined8 uStack_1b30;
  float local_1b28;
  float fStack_1b24;
  float fStack_1b20;
  float local_1b18;
  float fStack_1b14;
  float fStack_1b10;
  char *local_1b00;
  undefined1 local_1af8 [16];
  Intersectors *local_1ae0;
  char *local_1ad8;
  char *local_1ad0;
  char *local_1ac8;
  char *local_1ac0;
  vbool<4> terminated;
  long local_1aa8;
  char *local_1aa0;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  undefined8 uStack_1a30;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  undefined8 local_1998;
  undefined8 uStack_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  float local_1978;
  float fStack_1974;
  float fStack_1970;
  float fStack_196c;
  float local_1968;
  float fStack_1964;
  float fStack_1960;
  float fStack_195c;
  undefined1 local_1958 [16];
  undefined1 local_1948 [16];
  uint local_1938;
  uint uStack_1934;
  uint uStack_1930;
  uint uStack_192c;
  uint uStack_1928;
  uint uStack_1924;
  uint uStack_1920;
  uint uStack_191c;
  TravRayK<4,_true> tray;
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [8];
  float fStack_17c0;
  float fStack_17bc;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  undefined1 local_1788 [16];
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  undefined1 local_1758 [8];
  float fStack_1750;
  float fStack_174c;
  undefined8 local_1748;
  undefined8 uStack_1740;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar203 [16];
  undefined1 auVar214 [16];
  
  auVar12 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar62 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar64 = vpcmpeqd_avx(auVar62,(undefined1  [16])valid_i->field_0);
    auVar46 = ZEXT816(0) << 0x40;
    auVar87 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar46,5);
    auVar54 = auVar64 & auVar87;
    if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar54[0xf] < '\0')
    {
      auVar87 = vandps_avx(auVar87,auVar64);
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar222._8_4_ = 0x7fffffff;
      auVar222._0_8_ = 0x7fffffff7fffffff;
      auVar222._12_4_ = 0x7fffffff;
      auVar64 = vandps_avx(auVar222,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar63._8_4_ = 0x219392ef;
      auVar63._0_8_ = 0x219392ef219392ef;
      auVar63._12_4_ = 0x219392ef;
      auVar54 = vcmpps_avx(auVar64,auVar63,1);
      auVar225._8_4_ = 0x3f800000;
      auVar225._0_8_ = &DAT_3f8000003f800000;
      auVar225._12_4_ = 0x3f800000;
      auVar148 = vdivps_avx(auVar225,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar64 = vandps_avx(auVar222,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar135 = vcmpps_avx(auVar64,auVar63,1);
      auVar131 = vdivps_avx(auVar225,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar64 = vandps_avx(auVar222,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar64 = vcmpps_avx(auVar64,auVar63,1);
      auVar199._8_4_ = 0x5d5e0b6b;
      auVar199._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar199._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar148,auVar199,auVar54)
      ;
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar131,auVar199,auVar135);
      auVar54 = vdivps_avx(auVar225,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar54,auVar199,auVar64);
      auVar64 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar46,1);
      auVar148._8_4_ = 0x10;
      auVar148._0_8_ = 0x1000000010;
      auVar148._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar64,auVar148);
      auVar64 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar46,5);
      auVar54._8_4_ = 0x20;
      auVar54._0_8_ = 0x2000000020;
      auVar54._12_4_ = 0x20;
      auVar131._8_4_ = 0x30;
      auVar131._0_8_ = 0x3000000030;
      auVar131._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar131,auVar54,auVar64)
      ;
      auVar64 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar46,5);
      auVar135._8_4_ = 0x40;
      auVar135._0_8_ = 0x4000000040;
      auVar135._12_4_ = 0x40;
      auVar55._8_4_ = 0x50;
      auVar55._0_8_ = 0x5000000050;
      auVar55._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar55,auVar135,auVar64)
      ;
      auVar64 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar46);
      auVar54 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar46);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar227 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar64,auVar87);
      auVar64._8_4_ = 0xff800000;
      auVar64._0_8_ = 0xff800000ff800000;
      auVar64._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar64,auVar54,auVar87);
      terminated.field_0.i[1] = auVar87._4_4_ ^ auVar62._4_4_;
      terminated.field_0.i[0] = auVar87._0_4_ ^ auVar62._0_4_;
      terminated.field_0.i[2] = auVar87._8_4_ ^ auVar62._8_4_;
      terminated.field_0.i[3] = auVar87._12_4_ ^ auVar62._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar32 = 3;
      }
      else {
        uVar32 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar36 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar33 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar217 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar234 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar62 = vpcmpeqd_avx(in_ZMM14._0_16_,in_ZMM14._0_16_);
      auVar242 = ZEXT1664(auVar62);
      local_1ae0 = This;
LAB_0032f28c:
      paVar33 = paVar33 + -1;
      root.ptr = pNVar36[-1].ptr;
      pNVar36 = pNVar36 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0033081c;
      aVar65 = *paVar33;
      auVar62 = vcmpps_avx((undefined1  [16])aVar65,(undefined1  [16])tray.tfar.field_0,1);
      uVar24 = vmovmskps_avx(auVar62);
      if (uVar24 == 0) {
LAB_0033082d:
        iVar25 = 2;
      }
      else {
        uVar35 = (ulong)(uVar24 & 0xff);
        uVar24 = POPCOUNT(uVar24 & 0xff);
        iVar25 = 0;
        if (uVar24 <= uVar32) {
          do {
            sVar28 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> sVar28 & 1) == 0; sVar28 = sVar28 + 1) {
              }
            }
            auVar242 = ZEXT1664(auVar242._0_16_);
            bVar37 = occluded1(local_1ae0,bvh,root,sVar28,&pre,ray,&tray,context);
            if (bVar37) {
              terminated.field_0.i[sVar28] = -1;
            }
            uVar35 = uVar35 & uVar35 - 1;
          } while (uVar35 != 0);
          auVar62 = vpcmpeqd_avx(auVar242._0_16_,auVar242._0_16_);
          auVar242 = ZEXT1664(auVar62);
          auVar62 = auVar62 & ~(undefined1  [16])terminated.field_0;
          iVar25 = 3;
          auVar227 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar217 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar234 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar62[0xf] < '\0') {
            auVar62._8_4_ = 0xff800000;
            auVar62._0_8_ = 0xff800000ff800000;
            auVar62._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar62,
                               (undefined1  [16])terminated.field_0);
            iVar25 = 2;
          }
        }
        pGVar23 = pre.super_Precalculations.grid;
        if (uVar32 < uVar24) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0033081c;
              auVar62 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar65,6);
              if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar62 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar62 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar62[0xf]) goto LAB_0033082d;
              if (((uint)root.ptr & 0xf) != 8) {
                pre.super_Precalculations.grid = (GridSOA *)(root.ptr & 0xfffffffffffffff0);
                sVar28 = *(size_t *)
                          ((pre.super_Precalculations.grid)->data +
                          (pre.super_Precalculations.grid)->rootOffset);
                auVar62 = auVar12;
                goto LAB_003307b7;
              }
              auVar248 = ZEXT1664(auVar242._0_16_ ^ (undefined1  [16])terminated.field_0);
              uVar35 = (ulong)(pre.super_Precalculations.grid)->dim_offset;
              uVar27 = (ulong)(pre.super_Precalculations.grid)->width;
              uVar24 = (pre.super_Precalculations.grid)->height;
              lVar3 = uVar27 * 4;
              lVar29 = (ulong)(pre.super_Precalculations.grid)->gridOffset + (root.ptr >> 4) * 4;
              lVar31 = uVar35 * 0xc + lVar29;
              local_1ad8 = (pre.super_Precalculations.grid)->data + lVar31 + uVar27 * 4 + -4;
              lVar30 = lVar29 + uVar35 * 8;
              local_1ac0 = (pre.super_Precalculations.grid)->data + lVar30 + uVar27 * 4;
              lVar2 = lVar29 + uVar35 * 4;
              local_1ac8 = (pre.super_Precalculations.grid)->data + lVar2 + uVar27 * 4;
              local_1ad0 = (pre.super_Precalculations.grid)->data + lVar29 + uVar27 * 4;
              local_1b00 = (pre.super_Precalculations.grid)->data + lVar31;
              local_1aa0 = (pre.super_Precalculations.grid)->data + lVar30;
              pcVar34 = (pre.super_Precalculations.grid)->data + lVar2;
              lVar29 = (ulong)(pre.super_Precalculations.grid)->gridOffset + 0x2c +
                       (root.ptr >> 4) * 4;
              local_1aa8 = 0;
              goto LAB_0032f5a3;
            }
            auVar248 = ZEXT1664(auVar227._0_16_);
            uVar35 = 0;
            uVar27 = 8;
            do {
              uVar5 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar35 * 8);
              if (uVar5 != 8) {
                uVar26 = *(undefined4 *)(root.ptr + 0x20 + uVar35 * 4);
                auVar39._4_4_ = uVar26;
                auVar39._0_4_ = uVar26;
                auVar39._8_4_ = uVar26;
                auVar39._12_4_ = uVar26;
                auVar17._8_8_ = tray.org.field_0._8_8_;
                auVar17._0_8_ = tray.org.field_0._0_8_;
                auVar18._8_8_ = tray.org.field_0._24_8_;
                auVar18._0_8_ = tray.org.field_0._16_8_;
                auVar19._8_8_ = tray.org.field_0._40_8_;
                auVar19._0_8_ = tray.org.field_0._32_8_;
                auVar62 = vsubps_avx(auVar39,auVar17);
                auVar137._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar62._0_4_;
                auVar137._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar62._4_4_;
                auVar137._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar62._8_4_;
                auVar137._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar62._12_4_;
                uVar26 = *(undefined4 *)(root.ptr + 0x40 + uVar35 * 4);
                auVar40._4_4_ = uVar26;
                auVar40._0_4_ = uVar26;
                auVar40._8_4_ = uVar26;
                auVar40._12_4_ = uVar26;
                auVar62 = vsubps_avx(auVar40,auVar18);
                auVar171._0_4_ = tray.rdir.field_0._16_4_ * auVar62._0_4_;
                auVar171._4_4_ = tray.rdir.field_0._20_4_ * auVar62._4_4_;
                auVar171._8_4_ = tray.rdir.field_0._24_4_ * auVar62._8_4_;
                auVar171._12_4_ = tray.rdir.field_0._28_4_ * auVar62._12_4_;
                uVar26 = *(undefined4 *)(root.ptr + 0x60 + uVar35 * 4);
                auVar41._4_4_ = uVar26;
                auVar41._0_4_ = uVar26;
                auVar41._8_4_ = uVar26;
                auVar41._12_4_ = uVar26;
                auVar62 = vsubps_avx(auVar41,auVar19);
                auVar200._0_4_ = tray.rdir.field_0._32_4_ * auVar62._0_4_;
                auVar200._4_4_ = tray.rdir.field_0._36_4_ * auVar62._4_4_;
                auVar200._8_4_ = tray.rdir.field_0._40_4_ * auVar62._8_4_;
                auVar200._12_4_ = tray.rdir.field_0._44_4_ * auVar62._12_4_;
                uVar26 = *(undefined4 *)(root.ptr + 0x30 + uVar35 * 4);
                auVar42._4_4_ = uVar26;
                auVar42._0_4_ = uVar26;
                auVar42._8_4_ = uVar26;
                auVar42._12_4_ = uVar26;
                auVar62 = vsubps_avx(auVar42,auVar17);
                auVar69._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar62._0_4_;
                auVar69._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar62._4_4_;
                auVar69._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar62._8_4_;
                auVar69._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar62._12_4_;
                uVar26 = *(undefined4 *)(root.ptr + 0x50 + uVar35 * 4);
                auVar43._4_4_ = uVar26;
                auVar43._0_4_ = uVar26;
                auVar43._8_4_ = uVar26;
                auVar43._12_4_ = uVar26;
                auVar62 = vsubps_avx(auVar43,auVar18);
                auVar96._0_4_ = tray.rdir.field_0._16_4_ * auVar62._0_4_;
                auVar96._4_4_ = tray.rdir.field_0._20_4_ * auVar62._4_4_;
                auVar96._8_4_ = tray.rdir.field_0._24_4_ * auVar62._8_4_;
                auVar96._12_4_ = tray.rdir.field_0._28_4_ * auVar62._12_4_;
                uVar26 = *(undefined4 *)(root.ptr + 0x70 + uVar35 * 4);
                auVar44._4_4_ = uVar26;
                auVar44._0_4_ = uVar26;
                auVar44._8_4_ = uVar26;
                auVar44._12_4_ = uVar26;
                auVar62 = vsubps_avx(auVar44,auVar19);
                auVar114._0_4_ = tray.rdir.field_0._32_4_ * auVar62._0_4_;
                auVar114._4_4_ = tray.rdir.field_0._36_4_ * auVar62._4_4_;
                auVar114._8_4_ = tray.rdir.field_0._40_4_ * auVar62._8_4_;
                auVar114._12_4_ = tray.rdir.field_0._44_4_ * auVar62._12_4_;
                auVar62 = vminps_avx(auVar137,auVar69);
                auVar64 = vminps_avx(auVar171,auVar96);
                auVar62 = vmaxps_avx(auVar62,auVar64);
                auVar64 = vminps_avx(auVar200,auVar114);
                auVar62 = vmaxps_avx(auVar62,auVar64);
                auVar45._0_4_ = auVar217._0_4_ * auVar62._0_4_;
                auVar45._4_4_ = auVar217._4_4_ * auVar62._4_4_;
                auVar45._8_4_ = auVar217._8_4_ * auVar62._8_4_;
                auVar45._12_4_ = auVar217._12_4_ * auVar62._12_4_;
                auVar62 = vmaxps_avx(auVar137,auVar69);
                auVar64 = vmaxps_avx(auVar171,auVar96);
                auVar64 = vminps_avx(auVar62,auVar64);
                auVar62 = vmaxps_avx(auVar200,auVar114);
                auVar62 = vminps_avx(auVar64,auVar62);
                auVar70._0_4_ = auVar234._0_4_ * auVar62._0_4_;
                auVar70._4_4_ = auVar234._4_4_ * auVar62._4_4_;
                auVar70._8_4_ = auVar234._8_4_ * auVar62._8_4_;
                auVar70._12_4_ = auVar234._12_4_ * auVar62._12_4_;
                auVar62 = vmaxps_avx(auVar45,(undefined1  [16])tray.tnear.field_0);
                auVar64 = vminps_avx(auVar70,(undefined1  [16])tray.tfar.field_0);
                auVar62 = vcmpps_avx(auVar62,auVar64,2);
                if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar62[0xf] < '\0') {
                  auVar62 = vblendvps_avx(auVar227._0_16_,auVar45,auVar62);
                  if (uVar27 != 8) {
                    pNVar36->ptr = uVar27;
                    pNVar36 = pNVar36 + 1;
                    *paVar33 = auVar248._0_16_;
                    paVar33 = paVar33 + 1;
                  }
                  auVar248 = ZEXT1664(auVar62);
                  uVar27 = uVar5;
                }
              }
              aVar65 = auVar248._0_16_;
            } while ((uVar5 != 8) && (bVar37 = uVar35 < 3, uVar35 = uVar35 + 1, bVar37));
            iVar25 = 0;
            if (uVar27 == 8) {
LAB_0032f46e:
              bVar37 = false;
              iVar25 = 4;
            }
            else {
              auVar62 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar65,6);
              uVar26 = vmovmskps_avx(auVar62);
              bVar37 = true;
              if ((uint)POPCOUNT(uVar26) <= uVar32) {
                pNVar36->ptr = uVar27;
                pNVar36 = pNVar36 + 1;
                *paVar33 = aVar65;
                paVar33 = paVar33 + 1;
                goto LAB_0032f46e;
              }
            }
            root.ptr = uVar27;
          } while (bVar37);
        }
      }
      goto LAB_0033081f;
    }
  }
  return;
  while( true ) {
    local_1ad8 = local_1ad8 + lVar3;
    local_1ac0 = local_1ac0 + lVar3;
    local_1ac8 = local_1ac8 + lVar3;
    local_1ad0 = local_1ad0 + lVar3;
    local_1b00 = local_1b00 + lVar3;
    local_1aa0 = local_1aa0 + lVar3;
    pcVar34 = pcVar34 + lVar3;
    lVar29 = lVar29 + lVar3;
    bVar37 = local_1aa8 != 0;
    local_1aa8 = local_1aa8 + 1;
    if (bVar37) break;
LAB_0032f5a3:
    lVar30 = 0;
    do {
      if ((ulong)(uVar27 != 2) * 4 + 4 == lVar30) break;
      uVar26 = *(undefined4 *)(pGVar23->data + lVar30 + lVar29 + -0x30);
      auVar226._4_4_ = uVar26;
      auVar226._0_4_ = uVar26;
      auVar226._8_4_ = uVar26;
      auVar226._12_4_ = uVar26;
      uVar26 = *(undefined4 *)(pcVar34 + lVar30 + -4);
      auVar46._4_4_ = uVar26;
      auVar46._0_4_ = uVar26;
      auVar46._8_4_ = uVar26;
      auVar46._12_4_ = uVar26;
      uVar26 = *(undefined4 *)(local_1aa0 + lVar30 + -4);
      auVar71._4_4_ = uVar26;
      auVar71._0_4_ = uVar26;
      auVar71._8_4_ = uVar26;
      auVar71._12_4_ = uVar26;
      uVar26 = *(undefined4 *)(local_1ad0 + lVar30 + -4);
      auVar239._4_4_ = uVar26;
      auVar239._0_4_ = uVar26;
      auVar239._8_4_ = uVar26;
      auVar239._12_4_ = uVar26;
      uVar26 = *(undefined4 *)(local_1ac8 + lVar30 + -4);
      auVar97._4_4_ = uVar26;
      auVar97._0_4_ = uVar26;
      auVar97._8_4_ = uVar26;
      auVar97._12_4_ = uVar26;
      uVar26 = *(undefined4 *)(local_1ac0 + lVar30 + -4);
      auVar154._4_4_ = uVar26;
      auVar154._0_4_ = uVar26;
      auVar154._8_4_ = uVar26;
      auVar154._12_4_ = uVar26;
      auVar62 = *(undefined1 (*) [16])(ray + 0x10);
      auVar64 = *(undefined1 (*) [16])(ray + 0x20);
      auVar135 = vsubps_avx(auVar46,auVar62);
      auVar148 = vsubps_avx(auVar71,auVar64);
      auVar131 = vsubps_avx(auVar97,auVar62);
      auVar55 = vsubps_avx(auVar154,auVar64);
      auVar54 = vsubps_avx(auVar131,auVar135);
      auVar63 = vsubps_avx(auVar55,auVar148);
      fVar8 = auVar135._0_4_;
      fVar153 = auVar131._0_4_ + fVar8;
      fVar10 = auVar135._4_4_;
      fVar166 = auVar131._4_4_ + fVar10;
      fVar94 = auVar135._8_4_;
      fVar168 = auVar131._8_4_ + fVar94;
      fVar11 = auVar135._12_4_;
      fVar169 = auVar131._12_4_ + fVar11;
      fVar9 = auVar148._0_4_;
      fVar180 = auVar55._0_4_ + fVar9;
      fVar89 = auVar148._4_4_;
      fVar192 = auVar55._4_4_ + fVar89;
      fVar167 = auVar148._8_4_;
      fVar193 = auVar55._8_4_ + fVar167;
      fVar181 = auVar148._12_4_;
      fVar194 = auVar55._12_4_ + fVar181;
      auVar46 = auVar248._0_16_;
      fVar38 = auVar63._0_4_;
      auVar201._0_4_ = fVar153 * fVar38;
      fVar195 = auVar63._4_4_;
      auVar201._4_4_ = fVar166 * fVar195;
      fVar13 = auVar63._8_4_;
      auVar201._8_4_ = fVar168 * fVar13;
      fVar14 = auVar63._12_4_;
      auVar201._12_4_ = fVar169 * fVar14;
      fVar66 = auVar54._0_4_;
      auVar213._0_4_ = fVar180 * fVar66;
      fVar197 = auVar54._4_4_;
      auVar213._4_4_ = fVar192 * fVar197;
      fVar208 = auVar54._8_4_;
      auVar213._8_4_ = fVar193 * fVar208;
      fVar15 = auVar54._12_4_;
      auVar213._12_4_ = fVar194 * fVar15;
      auVar63 = vsubps_avx(auVar213,auVar201);
      auVar54 = *(undefined1 (*) [16])ray;
      auVar199 = vsubps_avx(auVar226,auVar54);
      auVar222 = vsubps_avx(auVar239,auVar54);
      auVar225 = vsubps_avx(auVar222,auVar199);
      fVar67 = auVar225._0_4_;
      auVar182._0_4_ = fVar180 * fVar67;
      fVar205 = auVar225._4_4_;
      auVar182._4_4_ = fVar192 * fVar205;
      fVar210 = auVar225._8_4_;
      auVar182._8_4_ = fVar193 * fVar210;
      fVar16 = auVar225._12_4_;
      auVar182._12_4_ = fVar194 * fVar16;
      fVar180 = auVar199._0_4_;
      fVar211 = auVar222._0_4_ + fVar180;
      fVar192 = auVar199._4_4_;
      fVar218 = auVar222._4_4_ + fVar192;
      fVar193 = auVar199._8_4_;
      fVar220 = auVar222._8_4_ + fVar193;
      fVar194 = auVar199._12_4_;
      fVar221 = auVar222._12_4_ + fVar194;
      auVar240._0_4_ = fVar211 * fVar38;
      auVar240._4_4_ = fVar218 * fVar195;
      auVar240._8_4_ = fVar220 * fVar13;
      auVar240._12_4_ = fVar221 * fVar14;
      auVar225 = vsubps_avx(auVar240,auVar182);
      auVar183._0_4_ = fVar211 * fVar66;
      auVar183._4_4_ = fVar218 * fVar197;
      auVar183._8_4_ = fVar220 * fVar208;
      auVar183._12_4_ = fVar221 * fVar15;
      auVar155._0_4_ = fVar67 * fVar153;
      auVar155._4_4_ = fVar205 * fVar166;
      auVar155._8_4_ = fVar210 * fVar168;
      auVar155._12_4_ = fVar16 * fVar169;
      auVar47 = vsubps_avx(auVar155,auVar183);
      auVar20 = *(undefined1 (*) [12])(ray + 0x60);
      fVar169 = *(float *)(ray + 0x6c);
      fVar211 = *(float *)(ray + 0x50);
      fVar218 = *(float *)(ray + 0x54);
      fVar220 = *(float *)(ray + 0x58);
      auVar21 = *(undefined1 (*) [12])(ray + 0x50);
      fVar221 = *(float *)(ray + 0x5c);
      fVar68 = *(float *)(ray + 0x40);
      fVar90 = *(float *)(ray + 0x44);
      fVar92 = *(float *)(ray + 0x48);
      auVar22 = *(undefined1 (*) [12])(ray + 0x40);
      fVar95 = *(float *)(ray + 0x4c);
      fVar212 = auVar63._0_4_ * fVar68 +
                auVar47._0_4_ * *(float *)(ray + 0x60) + fVar211 * auVar225._0_4_;
      fVar219 = auVar63._4_4_ * fVar90 +
                auVar47._4_4_ * *(float *)(ray + 100) + fVar218 * auVar225._4_4_;
      auVar214._0_8_ = CONCAT44(fVar219,fVar212);
      auVar214._8_4_ =
           auVar63._8_4_ * fVar92 +
           auVar47._8_4_ * *(float *)(ray + 0x68) + fVar220 * auVar225._8_4_;
      auVar214._12_4_ =
           auVar63._12_4_ * fVar95 + auVar47._12_4_ * fVar169 + fVar221 * auVar225._12_4_;
      uVar26 = *(undefined4 *)(pcVar34 + lVar30);
      auVar47._4_4_ = uVar26;
      auVar47._0_4_ = uVar26;
      auVar47._8_4_ = uVar26;
      auVar47._12_4_ = uVar26;
      auVar62 = vsubps_avx(auVar47,auVar62);
      uVar26 = *(undefined4 *)(local_1aa0 + lVar30);
      auVar72._4_4_ = uVar26;
      auVar72._0_4_ = uVar26;
      auVar72._8_4_ = uVar26;
      auVar72._12_4_ = uVar26;
      auVar64 = vsubps_avx(auVar72,auVar64);
      auVar135 = vsubps_avx(auVar135,auVar62);
      auVar148 = vsubps_avx(auVar148,auVar64);
      fVar170 = fVar8 + auVar62._0_4_;
      fVar177 = fVar10 + auVar62._4_4_;
      fVar178 = fVar94 + auVar62._8_4_;
      fVar179 = fVar11 + auVar62._12_4_;
      fVar153 = fVar9 + auVar64._0_4_;
      fVar166 = fVar89 + auVar64._4_4_;
      fVar168 = fVar167 + auVar64._8_4_;
      fVar151 = fVar181 + auVar64._12_4_;
      fVar238 = auVar148._0_4_;
      auVar232._0_4_ = fVar238 * fVar170;
      fVar243 = auVar148._4_4_;
      auVar232._4_4_ = fVar243 * fVar177;
      fVar244 = auVar148._8_4_;
      auVar232._8_4_ = fVar244 * fVar178;
      fVar245 = auVar148._12_4_;
      auVar232._12_4_ = fVar245 * fVar179;
      fVar198 = auVar135._0_4_;
      auVar156._0_4_ = fVar198 * fVar153;
      fVar206 = auVar135._4_4_;
      auVar156._4_4_ = fVar206 * fVar166;
      fVar124 = auVar135._8_4_;
      auVar156._8_4_ = fVar124 * fVar168;
      fVar125 = auVar135._12_4_;
      auVar156._12_4_ = fVar125 * fVar151;
      auVar135 = vsubps_avx(auVar156,auVar232);
      uVar26 = *(undefined4 *)(pGVar23->data + lVar30 + lVar29 + -0x2c);
      auVar184._4_4_ = uVar26;
      auVar184._0_4_ = uVar26;
      auVar184._8_4_ = uVar26;
      auVar184._12_4_ = uVar26;
      auVar54 = vsubps_avx(auVar184,auVar54);
      auVar148 = vsubps_avx(auVar199,auVar54);
      fVar231 = auVar148._0_4_;
      auVar138._0_4_ = fVar231 * fVar153;
      fVar235 = auVar148._4_4_;
      auVar138._4_4_ = fVar235 * fVar166;
      fVar236 = auVar148._8_4_;
      auVar138._8_4_ = fVar236 * fVar168;
      fVar237 = auVar148._12_4_;
      auVar138._12_4_ = fVar237 * fVar151;
      fVar153 = auVar54._0_4_ + fVar180;
      fVar166 = auVar54._4_4_ + fVar192;
      fVar168 = auVar54._8_4_ + fVar193;
      fVar151 = auVar54._12_4_ + fVar194;
      auVar185._0_4_ = fVar153 * fVar238;
      auVar185._4_4_ = fVar166 * fVar243;
      auVar185._8_4_ = fVar168 * fVar244;
      auVar185._12_4_ = fVar151 * fVar245;
      auVar148 = vsubps_avx(auVar185,auVar138);
      auVar186._0_4_ = fVar153 * fVar198;
      auVar186._4_4_ = fVar166 * fVar206;
      auVar186._8_4_ = fVar168 * fVar124;
      auVar186._12_4_ = fVar151 * fVar125;
      auVar172._0_4_ = fVar231 * fVar170;
      auVar172._4_4_ = fVar235 * fVar177;
      auVar172._8_4_ = fVar236 * fVar178;
      auVar172._12_4_ = fVar237 * fVar179;
      auVar63 = vsubps_avx(auVar172,auVar186);
      fVar153 = auVar20._0_4_;
      fVar166 = auVar20._4_4_;
      fVar168 = auVar20._8_4_;
      auVar173._0_4_ = fVar68 * auVar135._0_4_ + auVar63._0_4_ * fVar153 + fVar211 * auVar148._0_4_;
      auVar173._4_4_ = fVar90 * auVar135._4_4_ + auVar63._4_4_ * fVar166 + fVar218 * auVar148._4_4_;
      auVar173._8_4_ = fVar92 * auVar135._8_4_ + auVar63._8_4_ * fVar168 + fVar220 * auVar148._8_4_;
      auVar173._12_4_ =
           fVar95 * auVar135._12_4_ + auVar63._12_4_ * fVar169 + fVar221 * auVar148._12_4_;
      auVar135 = vsubps_avx(auVar54,auVar222);
      fVar136 = auVar54._0_4_ + auVar222._0_4_;
      fVar149 = auVar54._4_4_ + auVar222._4_4_;
      fVar150 = auVar54._8_4_ + auVar222._8_4_;
      fVar152 = auVar54._12_4_ + auVar222._12_4_;
      auVar54 = vsubps_avx(auVar62,auVar131);
      fVar151 = auVar62._0_4_ + auVar131._0_4_;
      fVar170 = auVar62._4_4_ + auVar131._4_4_;
      fVar177 = auVar62._8_4_ + auVar131._8_4_;
      fVar178 = auVar62._12_4_ + auVar131._12_4_;
      auVar62 = vsubps_avx(auVar64,auVar55);
      fVar179 = auVar64._0_4_ + auVar55._0_4_;
      fVar88 = auVar64._4_4_ + auVar55._4_4_;
      fVar91 = auVar64._8_4_ + auVar55._8_4_;
      fVar93 = auVar64._12_4_ + auVar55._12_4_;
      fVar196 = auVar62._0_4_;
      auVar98._0_4_ = fVar196 * fVar151;
      fVar204 = auVar62._4_4_;
      auVar98._4_4_ = fVar204 * fVar170;
      fVar207 = auVar62._8_4_;
      auVar98._8_4_ = fVar207 * fVar177;
      fVar209 = auVar62._12_4_;
      auVar98._12_4_ = fVar209 * fVar178;
      fVar224 = auVar54._0_4_;
      auVar157._0_4_ = fVar224 * fVar179;
      fVar228 = auVar54._4_4_;
      auVar157._4_4_ = fVar228 * fVar88;
      fVar229 = auVar54._8_4_;
      auVar157._8_4_ = fVar229 * fVar91;
      fVar230 = auVar54._12_4_;
      auVar157._12_4_ = fVar230 * fVar93;
      auVar62 = vsubps_avx(auVar157,auVar98);
      fVar246 = auVar135._0_4_;
      auVar73._0_4_ = fVar246 * fVar179;
      fVar179 = auVar135._4_4_;
      auVar73._4_4_ = fVar179 * fVar88;
      fVar88 = auVar135._8_4_;
      auVar73._8_4_ = fVar88 * fVar91;
      fVar91 = auVar135._12_4_;
      auVar73._12_4_ = fVar91 * fVar93;
      auVar158._0_4_ = fVar196 * fVar136;
      auVar158._4_4_ = fVar204 * fVar149;
      auVar158._8_4_ = fVar207 * fVar150;
      auVar158._12_4_ = fVar209 * fVar152;
      auVar64 = vsubps_avx(auVar158,auVar73);
      auVar159._8_4_ = 0x7fffffff;
      auVar159._0_8_ = 0x7fffffff7fffffff;
      auVar159._12_4_ = 0x7fffffff;
      auVar139._0_4_ = fVar224 * fVar136;
      auVar139._4_4_ = fVar228 * fVar149;
      auVar139._8_4_ = fVar229 * fVar150;
      auVar139._12_4_ = fVar230 * fVar152;
      auVar48._0_4_ = fVar246 * fVar151;
      auVar48._4_4_ = fVar179 * fVar170;
      auVar48._8_4_ = fVar88 * fVar177;
      auVar48._12_4_ = fVar91 * fVar178;
      auVar54 = vsubps_avx(auVar48,auVar139);
      auVar49._0_4_ = fVar68 * auVar62._0_4_ + auVar54._0_4_ * fVar153 + fVar211 * auVar64._0_4_;
      auVar49._4_4_ = fVar90 * auVar62._4_4_ + auVar54._4_4_ * fVar166 + fVar218 * auVar64._4_4_;
      auVar49._8_4_ = fVar92 * auVar62._8_4_ + auVar54._8_4_ * fVar168 + fVar220 * auVar64._8_4_;
      auVar49._12_4_ = fVar95 * auVar62._12_4_ + auVar54._12_4_ * fVar169 + fVar221 * auVar64._12_4_
      ;
      auVar126._0_4_ = auVar49._0_4_ + fVar212 + auVar173._0_4_;
      auVar126._4_4_ = auVar49._4_4_ + fVar219 + auVar173._4_4_;
      auVar126._8_4_ = auVar49._8_4_ + auVar214._8_4_ + auVar173._8_4_;
      auVar126._12_4_ = auVar49._12_4_ + auVar214._12_4_ + auVar173._12_4_;
      auVar62 = vandps_avx(auVar126,auVar159);
      auVar74._0_4_ = auVar62._0_4_ * 1.1920929e-07;
      auVar74._4_4_ = auVar62._4_4_ * 1.1920929e-07;
      auVar74._8_4_ = auVar62._8_4_ * 1.1920929e-07;
      auVar74._12_4_ = auVar62._12_4_ * 1.1920929e-07;
      auVar62 = vminps_avx(auVar214,auVar173);
      auVar62 = vminps_avx(auVar62,auVar49);
      uVar35 = CONCAT44(auVar74._4_4_,auVar74._0_4_);
      auVar140._0_8_ = uVar35 ^ 0x8000000080000000;
      auVar140._8_4_ = -auVar74._8_4_;
      auVar140._12_4_ = -auVar74._12_4_;
      auVar62 = vcmpps_avx(auVar62,auVar140,5);
      auVar64 = vmaxps_avx(auVar214,auVar173);
      auVar64 = vmaxps_avx(auVar64,auVar49);
      auVar64 = vcmpps_avx(auVar64,auVar74,2);
      auVar62 = vorps_avx(auVar62,auVar64);
      auVar64 = auVar46 & auVar62;
      auVar62 = vandps_avx(auVar46,auVar62);
      if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar64 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar64 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar64[0xf])
      {
        auVar64 = ZEXT816(0) << 0x20;
      }
      else {
        auVar50._0_4_ = fVar38 * fVar198;
        auVar50._4_4_ = fVar195 * fVar206;
        auVar50._8_4_ = fVar13 * fVar124;
        auVar50._12_4_ = fVar14 * fVar125;
        auVar75._0_4_ = fVar66 * fVar238;
        auVar75._4_4_ = fVar197 * fVar243;
        auVar75._8_4_ = fVar208 * fVar244;
        auVar75._12_4_ = fVar15 * fVar245;
        auVar135 = vsubps_avx(auVar75,auVar50);
        auVar99._0_4_ = fVar224 * fVar238;
        auVar99._4_4_ = fVar228 * fVar243;
        auVar99._8_4_ = fVar229 * fVar244;
        auVar99._12_4_ = fVar230 * fVar245;
        auVar141._0_4_ = fVar196 * fVar198;
        auVar141._4_4_ = fVar204 * fVar206;
        auVar141._8_4_ = fVar207 * fVar124;
        auVar141._12_4_ = fVar209 * fVar125;
        auVar148 = vsubps_avx(auVar141,auVar99);
        auVar64 = vandps_avx(auVar50,auVar159);
        auVar54 = vandps_avx(auVar99,auVar159);
        auVar64 = vcmpps_avx(auVar64,auVar54,1);
        auVar135 = vblendvps_avx(auVar148,auVar135,auVar64);
        auVar51._0_4_ = fVar231 * fVar196;
        auVar51._4_4_ = fVar235 * fVar204;
        auVar51._8_4_ = fVar236 * fVar207;
        auVar51._12_4_ = fVar237 * fVar209;
        auVar76._0_4_ = fVar231 * fVar38;
        auVar76._4_4_ = fVar235 * fVar195;
        auVar76._8_4_ = fVar236 * fVar13;
        auVar76._12_4_ = fVar237 * fVar14;
        auVar127._0_4_ = fVar67 * fVar238;
        auVar127._4_4_ = fVar205 * fVar243;
        auVar127._8_4_ = fVar210 * fVar244;
        auVar127._12_4_ = fVar16 * fVar245;
        auVar148 = vsubps_avx(auVar76,auVar127);
        auVar142._0_4_ = fVar246 * fVar238;
        auVar142._4_4_ = fVar179 * fVar243;
        auVar142._8_4_ = fVar88 * fVar244;
        auVar142._12_4_ = fVar91 * fVar245;
        auVar131 = vsubps_avx(auVar142,auVar51);
        auVar64 = vandps_avx(auVar127,auVar159);
        auVar54 = vandps_avx(auVar51,auVar159);
        auVar64 = vcmpps_avx(auVar64,auVar54,1);
        auVar148 = vblendvps_avx(auVar131,auVar148,auVar64);
        auVar52._0_4_ = fVar246 * fVar198;
        auVar52._4_4_ = fVar179 * fVar206;
        auVar52._8_4_ = fVar88 * fVar124;
        auVar52._12_4_ = fVar91 * fVar125;
        auVar77._0_4_ = fVar67 * fVar198;
        auVar77._4_4_ = fVar205 * fVar206;
        auVar77._8_4_ = fVar210 * fVar124;
        auVar77._12_4_ = fVar16 * fVar125;
        auVar143._0_4_ = fVar231 * fVar66;
        auVar143._4_4_ = fVar235 * fVar197;
        auVar143._8_4_ = fVar236 * fVar208;
        auVar143._12_4_ = fVar237 * fVar15;
        auVar160._0_4_ = fVar231 * fVar224;
        auVar160._4_4_ = fVar235 * fVar228;
        auVar160._8_4_ = fVar236 * fVar229;
        auVar160._12_4_ = fVar237 * fVar230;
        auVar131 = vsubps_avx(auVar77,auVar143);
        auVar55 = vsubps_avx(auVar160,auVar52);
        auVar64 = vandps_avx(auVar159,auVar143);
        auVar54 = vandps_avx(auVar159,auVar52);
        auVar64 = vcmpps_avx(auVar64,auVar54,1);
        auVar131 = vblendvps_avx(auVar55,auVar131,auVar64);
        local_1b28 = auVar21._0_4_;
        fStack_1b24 = auVar21._4_4_;
        fStack_1b20 = auVar21._8_4_;
        local_1b18 = auVar22._0_4_;
        fStack_1b14 = auVar22._4_4_;
        fStack_1b10 = auVar22._8_4_;
        fVar38 = auVar135._0_4_ * local_1b18 +
                 auVar131._0_4_ * fVar153 + auVar148._0_4_ * local_1b28;
        fVar66 = auVar135._4_4_ * fStack_1b14 +
                 auVar131._4_4_ * fVar166 + auVar148._4_4_ * fStack_1b24;
        fVar67 = auVar135._8_4_ * fStack_1b10 +
                 auVar131._8_4_ * fVar168 + auVar148._8_4_ * fStack_1b20;
        fVar153 = auVar135._12_4_ * fVar95 + auVar131._12_4_ * fVar169 + auVar148._12_4_ * fVar221;
        auVar53._0_4_ = fVar38 + fVar38;
        auVar53._4_4_ = fVar66 + fVar66;
        auVar53._8_4_ = fVar67 + fVar67;
        auVar53._12_4_ = fVar153 + fVar153;
        fVar38 = auVar135._0_4_ * fVar180 + auVar131._0_4_ * fVar9 + auVar148._0_4_ * fVar8;
        fVar89 = auVar135._4_4_ * fVar192 + auVar131._4_4_ * fVar89 + auVar148._4_4_ * fVar10;
        fVar192 = auVar135._8_4_ * fVar193 + auVar131._8_4_ * fVar167 + auVar148._8_4_ * fVar94;
        fVar94 = auVar135._12_4_ * fVar194 + auVar131._12_4_ * fVar181 + auVar148._12_4_ * fVar11;
        auVar64 = vrcpps_avx(auVar53);
        fVar8 = auVar64._0_4_;
        auVar161._0_4_ = auVar53._0_4_ * fVar8;
        fVar9 = auVar64._4_4_;
        auVar161._4_4_ = auVar53._4_4_ * fVar9;
        fVar180 = auVar64._8_4_;
        auVar161._8_4_ = auVar53._8_4_ * fVar180;
        fVar10 = auVar64._12_4_;
        auVar161._12_4_ = auVar53._12_4_ * fVar10;
        auVar187._8_4_ = 0x3f800000;
        auVar187._0_8_ = &DAT_3f8000003f800000;
        auVar187._12_4_ = 0x3f800000;
        auVar64 = vsubps_avx(auVar187,auVar161);
        auVar78._0_4_ = (fVar38 + fVar38) * (fVar8 + fVar8 * auVar64._0_4_);
        auVar78._4_4_ = (fVar89 + fVar89) * (fVar9 + fVar9 * auVar64._4_4_);
        auVar78._8_4_ = (fVar192 + fVar192) * (fVar180 + fVar180 * auVar64._8_4_);
        auVar78._12_4_ = (fVar94 + fVar94) * (fVar10 + fVar10 * auVar64._12_4_);
        auVar64 = vcmpps_avx(auVar78,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar54 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar78,2);
        auVar54 = vandps_avx(auVar54,auVar64);
        auVar64 = ZEXT816(0);
        auVar55 = vcmpps_avx(auVar64,auVar53,4);
        auVar54 = vandps_avx(auVar55,auVar54);
        auVar54 = vpslld_avx(auVar54,0x1f);
        auVar55 = vpsrad_avx(auVar54,0x1f);
        auVar54 = auVar62 & auVar55;
        auVar62 = vandps_avx(auVar55,auVar62);
        if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar54[0xf] < '\0') {
          uStack_1a30 = auVar214._8_8_;
          uStack_1740 = uStack_1a30;
          local_17a8 = auVar131;
          local_1798 = auVar148;
          local_1788 = auVar135;
          local_1778 = auVar78;
          local_1768 = auVar126;
          _local_1758 = auVar173;
          local_1748 = auVar214._0_8_;
        }
      }
      auVar234 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar227 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar217 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      local_1b58._4_4_ = *(undefined4 *)(local_1ad0 + lVar30);
      local_1b58._0_4_ = local_1b58._4_4_;
      local_1b58._8_4_ = local_1b58._4_4_;
      local_1b58._12_4_ = local_1b58._4_4_;
      uVar26 = *(undefined4 *)(local_1ac8 + lVar30);
      auVar100._4_4_ = uVar26;
      auVar100._0_4_ = uVar26;
      auVar100._8_4_ = uVar26;
      auVar100._12_4_ = uVar26;
      uVar26 = *(undefined4 *)(local_1ac0 + lVar30);
      auVar241._4_4_ = uVar26;
      auVar241._0_4_ = uVar26;
      auVar241._8_4_ = uVar26;
      auVar241._12_4_ = uVar26;
      pGVar6 = (context->scene->geometries).items[(pre.super_Precalculations.grid)->_geomID].ptr;
      uVar4 = pGVar6->mask;
      auVar79._4_4_ = uVar4;
      auVar79._0_4_ = uVar4;
      auVar79._8_4_ = uVar4;
      auVar79._12_4_ = uVar4;
      auVar54 = vandps_avx(auVar79,*(undefined1 (*) [16])(ray + 0x90));
      auVar54 = vpcmpeqd_avx(auVar64,auVar54);
      auVar135 = auVar62 & ~auVar54;
      if ((((auVar135 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar135 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar135 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          auVar135[0xf] < '\0') {
        auVar62 = vandnps_avx(auVar54,auVar62);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar54 = vandps_avx(auVar159,local_1768);
          auVar135 = vrcpps_avx(local_1768);
          fVar8 = auVar135._0_4_;
          auVar118._0_4_ = local_1768._0_4_ * fVar8;
          fVar9 = auVar135._4_4_;
          auVar118._4_4_ = local_1768._4_4_ * fVar9;
          fVar180 = auVar135._8_4_;
          auVar118._8_4_ = local_1768._8_4_ * fVar180;
          fVar10 = auVar135._12_4_;
          auVar118._12_4_ = local_1768._12_4_ * fVar10;
          auVar164._8_4_ = 0x3f800000;
          auVar164._0_8_ = &DAT_3f8000003f800000;
          auVar164._12_4_ = 0x3f800000;
          auVar135 = vsubps_avx(auVar164,auVar118);
          auVar107._0_4_ = fVar8 + fVar8 * auVar135._0_4_;
          auVar107._4_4_ = fVar9 + fVar9 * auVar135._4_4_;
          auVar107._8_4_ = fVar180 + fVar180 * auVar135._8_4_;
          auVar107._12_4_ = fVar10 + fVar10 * auVar135._12_4_;
          auVar119._8_4_ = 0x219392ef;
          auVar119._0_8_ = 0x219392ef219392ef;
          auVar119._12_4_ = 0x219392ef;
          auVar54 = vcmpps_avx(auVar54,auVar119,5);
          auVar54 = vandps_avx(auVar54,auVar107);
          auVar85._0_4_ = auVar54._0_4_ * (float)local_1748;
          auVar85._4_4_ = auVar54._4_4_ * local_1748._4_4_;
          auVar85._8_4_ = auVar54._8_4_ * (float)uStack_1740;
          auVar85._12_4_ = auVar54._12_4_ * uStack_1740._4_4_;
          auVar63 = vminps_avx(auVar85,auVar164);
          auVar108._0_4_ = auVar54._0_4_ * (float)local_1758._0_4_;
          auVar108._4_4_ = auVar54._4_4_ * (float)local_1758._4_4_;
          auVar108._8_4_ = auVar54._8_4_ * fStack_1750;
          auVar108._12_4_ = auVar54._12_4_ * fStack_174c;
          auVar199 = vminps_avx(auVar108,auVar164);
          uVar26 = *(undefined4 *)(local_1b00 + lVar30 + -4);
          auVar120._4_4_ = uVar26;
          auVar120._0_4_ = uVar26;
          auVar120._8_4_ = uVar26;
          auVar120._12_4_ = uVar26;
          uVar26 = *(undefined4 *)(local_1ad8 + lVar30);
          auVar130._4_4_ = uVar26;
          auVar130._0_4_ = uVar26;
          auVar130._8_4_ = uVar26;
          auVar130._12_4_ = uVar26;
          auVar135 = vpsrld_avx(auVar120,0x10);
          auVar54 = vpblendw_avx(auVar120,auVar64,0xaa);
          auVar54 = vcvtdq2ps_avx(auVar54);
          auVar135 = vcvtdq2ps_avx(auVar135);
          auVar148 = vsubps_avx(auVar164,auVar63);
          auVar222 = vsubps_avx(auVar148,auVar199);
          auVar148 = vpblendw_avx(auVar130,auVar64,0xaa);
          auVar148 = vcvtdq2ps_avx(auVar148);
          auVar131 = vpsrld_avx(auVar130,0x10);
          auVar131 = vcvtdq2ps_avx(auVar131);
          uVar26 = *(undefined4 *)(local_1b00 + lVar30);
          auVar132._4_4_ = uVar26;
          auVar132._0_4_ = uVar26;
          auVar132._8_4_ = uVar26;
          auVar132._12_4_ = uVar26;
          auVar55 = vpblendw_avx(auVar132,auVar64,0xaa);
          auVar55 = vcvtdq2ps_avx(auVar55);
          local_1978 = auVar63._0_4_ * auVar55._0_4_ * 0.00012207031 +
                       auVar222._0_4_ * auVar54._0_4_ * 0.00012207031 +
                       auVar199._0_4_ * auVar148._0_4_ * 0.00012207031;
          fStack_1974 = auVar63._4_4_ * auVar55._4_4_ * 0.00012207031 +
                        auVar222._4_4_ * auVar54._4_4_ * 0.00012207031 +
                        auVar199._4_4_ * auVar148._4_4_ * 0.00012207031;
          fStack_1970 = auVar63._8_4_ * auVar55._8_4_ * 0.00012207031 +
                        auVar222._8_4_ * auVar54._8_4_ * 0.00012207031 +
                        auVar199._8_4_ * auVar148._8_4_ * 0.00012207031;
          fStack_196c = auVar63._12_4_ * auVar55._12_4_ * 0.00012207031 +
                        auVar222._12_4_ * auVar54._12_4_ * 0.00012207031 +
                        auVar199._12_4_ * auVar148._12_4_ * 0.00012207031;
          auVar54 = vpsrld_avx(auVar132,0x10);
          auVar54 = vcvtdq2ps_avx(auVar54);
          local_1968 = auVar63._0_4_ * auVar54._0_4_ * 0.00012207031 +
                       auVar222._0_4_ * auVar135._0_4_ * 0.00012207031 +
                       auVar199._0_4_ * auVar131._0_4_ * 0.00012207031;
          fStack_1964 = auVar63._4_4_ * auVar54._4_4_ * 0.00012207031 +
                        auVar222._4_4_ * auVar135._4_4_ * 0.00012207031 +
                        auVar199._4_4_ * auVar131._4_4_ * 0.00012207031;
          fStack_1960 = auVar63._8_4_ * auVar54._8_4_ * 0.00012207031 +
                        auVar222._8_4_ * auVar135._8_4_ * 0.00012207031 +
                        auVar199._8_4_ * auVar131._8_4_ * 0.00012207031;
          fStack_195c = auVar63._12_4_ * auVar54._12_4_ * 0.00012207031 +
                        auVar222._12_4_ * auVar135._12_4_ * 0.00012207031 +
                        auVar199._12_4_ * auVar131._12_4_ * 0.00012207031;
          local_19a8 = local_1788._0_8_;
          uStack_19a0 = local_1788._8_8_;
          local_1998 = local_1798._0_8_;
          uStack_1990 = local_1798._8_8_;
          local_1988 = local_17a8._0_8_;
          uStack_1980 = local_17a8._8_8_;
          local_1948 = vpshufd_avx(ZEXT416((pre.super_Precalculations.grid)->_geomID),0);
          local_1958 = vpshufd_avx(ZEXT416((pre.super_Precalculations.grid)->_primID),0);
          vcmpps_avx(ZEXT1632(local_1958),ZEXT1632(local_1958),0xf);
          uStack_1934 = context->user->instID[0];
          local_1938 = uStack_1934;
          uStack_1930 = uStack_1934;
          uStack_192c = uStack_1934;
          uStack_1928 = context->user->instPrimID[0];
          uStack_1924 = uStack_1928;
          uStack_1920 = uStack_1928;
          uStack_191c = uStack_1928;
          auVar54 = *(undefined1 (*) [16])(ray + 0x80);
          auVar135 = vblendvps_avx(auVar54,local_1778,auVar62);
          *(undefined1 (*) [16])(ray + 0x80) = auVar135;
          args.valid = (int *)local_1af8;
          args.geometryUserPtr = pGVar6->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_19a8;
          args.N = 4;
          local_1af8 = auVar62;
          args.ray = (RTCRayN *)ray;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar6->occlusionFilterN)(&args);
            auVar227._8_56_ = extraout_var_00;
            auVar227._0_8_ = extraout_XMM1_Qa;
            auVar135 = auVar227._0_16_;
            auVar64 = ZEXT816(0) << 0x40;
            auVar234 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            auVar217 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
            auVar227 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (local_1af8 == (undefined1  [16])0x0) {
            auVar62 = vpcmpeqd_avx(auVar64,(undefined1  [16])0x0);
            auVar64 = vpcmpeqd_avx(auVar135,auVar135);
            auVar62 = auVar62 ^ auVar64;
          }
          else {
            p_Var7 = context->args->filter;
            auVar62 = vpcmpeqd_avx(local_1af8,local_1af8);
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              auVar217._0_8_ = (*p_Var7)(&args);
              auVar217._8_56_ = extraout_var;
              auVar64 = ZEXT816(0) << 0x40;
              auVar62 = vpcmpeqd_avx(auVar217._0_16_,auVar217._0_16_);
              auVar234 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar217 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar227 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            auVar64 = vpcmpeqd_avx(auVar64,local_1af8);
            auVar62 = auVar64 ^ auVar62;
            auVar109._8_4_ = 0xff800000;
            auVar109._0_8_ = 0xff800000ff800000;
            auVar109._12_4_ = 0xff800000;
            auVar64 = vblendvps_avx(auVar109,*(undefined1 (*) [16])(args.ray + 0x80),auVar64);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar64;
          }
          auVar64 = vpslld_avx(auVar62,0x1f);
          auVar62 = vpsrad_avx(auVar64,0x1f);
          auVar64 = vblendvps_avx(auVar54,*(undefined1 (*) [16])pRVar1,auVar64);
          *(undefined1 (*) [16])pRVar1 = auVar64;
        }
        auVar46 = vpandn_avx(auVar62,auVar46);
      }
      auVar248 = ZEXT1664(auVar46);
      if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar46 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar46 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar46[0xf])
      {
        auVar62 = vpcmpeqd_avx(auVar241,auVar241);
        auVar242 = ZEXT1664(auVar62);
        break;
      }
      auVar62 = *(undefined1 (*) [16])ray;
      auVar64 = *(undefined1 (*) [16])(ray + 0x10);
      auVar54 = *(undefined1 (*) [16])(ray + 0x20);
      auVar135 = vsubps_avx(auVar239,auVar62);
      auVar148 = vsubps_avx(auVar97,auVar64);
      auVar131 = vsubps_avx(auVar154,auVar54);
      auVar55 = vsubps_avx(auVar184,auVar62);
      auVar63 = vsubps_avx(auVar47,auVar64);
      auVar199 = vsubps_avx(auVar72,auVar54);
      auVar222 = vsubps_avx(local_1b58,auVar62);
      auVar64 = vsubps_avx(auVar100,auVar64);
      auVar54 = vsubps_avx(auVar241,auVar54);
      auVar62 = vsubps_avx(auVar222,auVar135);
      auVar225 = vsubps_avx(auVar64,auVar148);
      auVar47 = vsubps_avx(auVar54,auVar131);
      fVar150 = auVar148._0_4_;
      fVar94 = fVar150 + auVar64._0_4_;
      fVar196 = auVar148._4_4_;
      fVar167 = fVar196 + auVar64._4_4_;
      fVar207 = auVar148._8_4_;
      fVar193 = fVar207 + auVar64._8_4_;
      fVar212 = auVar148._12_4_;
      fVar194 = fVar212 + auVar64._12_4_;
      fVar238 = auVar131._0_4_;
      fVar181 = fVar238 + auVar54._0_4_;
      fVar244 = auVar131._4_4_;
      fVar38 = fVar244 + auVar54._4_4_;
      fVar245 = auVar131._8_4_;
      fVar66 = fVar245 + auVar54._8_4_;
      fVar246 = auVar131._12_4_;
      fVar195 = fVar246 + auVar54._12_4_;
      fVar89 = auVar47._0_4_;
      auVar202._0_4_ = fVar94 * fVar89;
      fVar11 = auVar47._4_4_;
      auVar202._4_4_ = fVar167 * fVar11;
      fVar67 = auVar47._8_4_;
      auVar202._8_4_ = fVar193 * fVar67;
      fVar166 = auVar47._12_4_;
      auVar202._12_4_ = fVar194 * fVar166;
      fVar224 = auVar225._0_4_;
      auVar215._0_4_ = fVar224 * fVar181;
      fVar229 = auVar225._4_4_;
      auVar215._4_4_ = fVar229 * fVar38;
      fVar231 = auVar225._8_4_;
      auVar215._8_4_ = fVar231 * fVar66;
      fVar236 = auVar225._12_4_;
      auVar215._12_4_ = fVar236 * fVar195;
      auVar225 = vsubps_avx(auVar215,auVar202);
      fVar8 = auVar135._0_4_;
      fVar197 = auVar222._0_4_ + fVar8;
      fVar9 = auVar135._4_4_;
      fVar205 = auVar222._4_4_ + fVar9;
      fVar180 = auVar135._8_4_;
      fVar208 = auVar222._8_4_ + fVar180;
      fVar10 = auVar135._12_4_;
      fVar210 = auVar222._12_4_ + fVar10;
      fVar192 = auVar62._0_4_;
      auVar188._0_4_ = fVar181 * fVar192;
      fVar181 = auVar62._4_4_;
      auVar188._4_4_ = fVar38 * fVar181;
      fVar153 = auVar62._8_4_;
      auVar188._8_4_ = fVar66 * fVar153;
      fVar13 = auVar62._12_4_;
      auVar188._12_4_ = fVar195 * fVar13;
      auVar216._0_4_ = fVar197 * fVar89;
      auVar216._4_4_ = fVar205 * fVar11;
      auVar216._8_4_ = fVar208 * fVar67;
      auVar216._12_4_ = fVar210 * fVar166;
      auVar47 = vsubps_avx(auVar216,auVar188);
      auVar189._0_4_ = fVar197 * fVar224;
      auVar189._4_4_ = fVar205 * fVar229;
      auVar189._8_4_ = fVar208 * fVar231;
      auVar189._12_4_ = fVar210 * fVar236;
      auVar162._0_4_ = fVar192 * fVar94;
      auVar162._4_4_ = fVar181 * fVar167;
      auVar162._8_4_ = fVar153 * fVar193;
      auVar162._12_4_ = fVar13 * fVar194;
      auVar48 = vsubps_avx(auVar162,auVar189);
      auVar62 = *(undefined1 (*) [16])(ray + 0x60);
      fVar94 = auVar62._0_4_;
      fVar194 = auVar62._4_4_;
      fVar195 = auVar62._8_4_;
      fVar208 = auVar62._12_4_;
      auVar62 = *(undefined1 (*) [16])(ray + 0x50);
      fVar228 = auVar62._0_4_;
      fVar230 = auVar62._4_4_;
      fVar235 = auVar62._8_4_;
      fVar237 = auVar62._12_4_;
      fVar14 = *(float *)(ray + 0x40);
      fVar15 = *(float *)(ray + 0x44);
      fVar16 = *(float *)(ray + 0x48);
      auVar20 = *(undefined1 (*) [12])(ray + 0x40);
      fVar169 = *(float *)(ray + 0x4c);
      fVar198 = fVar14 * auVar225._0_4_ + fVar228 * auVar47._0_4_ + auVar48._0_4_ * fVar94;
      fVar206 = fVar15 * auVar225._4_4_ + fVar230 * auVar47._4_4_ + auVar48._4_4_ * fVar194;
      auVar203._0_8_ = CONCAT44(fVar206,fVar198);
      auVar203._8_4_ = fVar16 * auVar225._8_4_ + fVar235 * auVar47._8_4_ + auVar48._8_4_ * fVar195;
      auVar203._12_4_ =
           fVar169 * auVar225._12_4_ + fVar237 * auVar47._12_4_ + auVar48._12_4_ * fVar208;
      auVar148 = vsubps_avx(auVar148,auVar63);
      auVar131 = vsubps_avx(auVar131,auVar199);
      fVar193 = fVar150 + auVar63._0_4_;
      fVar66 = fVar196 + auVar63._4_4_;
      fVar205 = fVar207 + auVar63._8_4_;
      fVar168 = fVar212 + auVar63._12_4_;
      fVar211 = fVar238 + auVar199._0_4_;
      fVar218 = fVar244 + auVar199._4_4_;
      fVar220 = fVar245 + auVar199._8_4_;
      fVar221 = fVar246 + auVar199._12_4_;
      fVar124 = auVar131._0_4_;
      auVar233._0_4_ = fVar124 * fVar193;
      fVar125 = auVar131._4_4_;
      auVar233._4_4_ = fVar125 * fVar66;
      fVar136 = auVar131._8_4_;
      auVar233._8_4_ = fVar136 * fVar205;
      fVar149 = auVar131._12_4_;
      auVar233._12_4_ = fVar149 * fVar168;
      fVar167 = auVar148._0_4_;
      auVar101._0_4_ = fVar211 * fVar167;
      fVar38 = auVar148._4_4_;
      auVar101._4_4_ = fVar218 * fVar38;
      fVar197 = auVar148._8_4_;
      auVar101._8_4_ = fVar220 * fVar197;
      fVar210 = auVar148._12_4_;
      auVar101._12_4_ = fVar221 * fVar210;
      auVar148 = vsubps_avx(auVar101,auVar233);
      auVar135 = vsubps_avx(auVar135,auVar55);
      fVar152 = auVar135._0_4_;
      auVar247._0_4_ = fVar152 * fVar211;
      fVar204 = auVar135._4_4_;
      auVar247._4_4_ = fVar204 * fVar218;
      fVar209 = auVar135._8_4_;
      auVar247._8_4_ = fVar209 * fVar220;
      fVar219 = auVar135._12_4_;
      auVar247._12_4_ = fVar219 * fVar221;
      fVar211 = fVar8 + auVar55._0_4_;
      fVar218 = fVar9 + auVar55._4_4_;
      fVar220 = fVar180 + auVar55._8_4_;
      fVar221 = fVar10 + auVar55._12_4_;
      auVar190._0_4_ = fVar124 * fVar211;
      auVar190._4_4_ = fVar125 * fVar218;
      auVar190._8_4_ = fVar136 * fVar220;
      auVar190._12_4_ = fVar149 * fVar221;
      auVar135 = vsubps_avx(auVar190,auVar247);
      auVar174._0_4_ = fVar211 * fVar167;
      auVar174._4_4_ = fVar218 * fVar38;
      auVar174._8_4_ = fVar220 * fVar197;
      auVar174._12_4_ = fVar221 * fVar210;
      auVar163._0_4_ = fVar152 * fVar193;
      auVar163._4_4_ = fVar204 * fVar66;
      auVar163._8_4_ = fVar209 * fVar205;
      auVar163._12_4_ = fVar219 * fVar168;
      auVar131 = vsubps_avx(auVar163,auVar174);
      auVar175._0_4_ = fVar14 * auVar148._0_4_ + auVar131._0_4_ * fVar94 + fVar228 * auVar135._0_4_;
      auVar175._4_4_ = fVar15 * auVar148._4_4_ + auVar131._4_4_ * fVar194 + fVar230 * auVar135._4_4_
      ;
      auVar175._8_4_ = fVar16 * auVar148._8_4_ + auVar131._8_4_ * fVar195 + fVar235 * auVar135._8_4_
      ;
      auVar175._12_4_ =
           fVar169 * auVar148._12_4_ + auVar131._12_4_ * fVar208 + fVar237 * auVar135._12_4_;
      auVar135 = vsubps_avx(auVar55,auVar222);
      fVar68 = auVar55._0_4_ + auVar222._0_4_;
      fVar90 = auVar55._4_4_ + auVar222._4_4_;
      fVar92 = auVar55._8_4_ + auVar222._8_4_;
      fVar95 = auVar55._12_4_ + auVar222._12_4_;
      auVar148 = vsubps_avx(auVar63,auVar64);
      fVar211 = auVar63._0_4_ + auVar64._0_4_;
      fVar218 = auVar63._4_4_ + auVar64._4_4_;
      fVar220 = auVar63._8_4_ + auVar64._8_4_;
      fVar221 = auVar63._12_4_ + auVar64._12_4_;
      auVar64 = vsubps_avx(auVar199,auVar54);
      fVar151 = auVar199._0_4_ + auVar54._0_4_;
      fVar170 = auVar199._4_4_ + auVar54._4_4_;
      fVar177 = auVar199._8_4_ + auVar54._8_4_;
      fVar178 = auVar199._12_4_ + auVar54._12_4_;
      fVar193 = auVar64._0_4_;
      auVar115._0_4_ = fVar211 * fVar193;
      fVar66 = auVar64._4_4_;
      auVar115._4_4_ = fVar218 * fVar66;
      fVar205 = auVar64._8_4_;
      auVar115._8_4_ = fVar220 * fVar205;
      fVar168 = auVar64._12_4_;
      auVar115._12_4_ = fVar221 * fVar168;
      fVar179 = auVar148._0_4_;
      auVar144._0_4_ = fVar179 * fVar151;
      fVar88 = auVar148._4_4_;
      auVar144._4_4_ = fVar88 * fVar170;
      fVar91 = auVar148._8_4_;
      auVar144._8_4_ = fVar91 * fVar177;
      fVar93 = auVar148._12_4_;
      auVar144._12_4_ = fVar93 * fVar178;
      auVar64 = vsubps_avx(auVar144,auVar115);
      fVar243 = auVar135._0_4_;
      auVar102._0_4_ = fVar243 * fVar151;
      fVar151 = auVar135._4_4_;
      auVar102._4_4_ = fVar151 * fVar170;
      fVar170 = auVar135._8_4_;
      auVar102._8_4_ = fVar170 * fVar177;
      fVar177 = auVar135._12_4_;
      auVar102._12_4_ = fVar177 * fVar178;
      auVar145._0_4_ = fVar68 * fVar193;
      auVar145._4_4_ = fVar90 * fVar66;
      auVar145._8_4_ = fVar92 * fVar205;
      auVar145._12_4_ = fVar95 * fVar168;
      auVar54 = vsubps_avx(auVar145,auVar102);
      auVar146._8_4_ = 0x7fffffff;
      auVar146._0_8_ = 0x7fffffff7fffffff;
      auVar146._12_4_ = 0x7fffffff;
      auVar80._0_4_ = fVar179 * fVar68;
      auVar80._4_4_ = fVar88 * fVar90;
      auVar80._8_4_ = fVar91 * fVar92;
      auVar80._12_4_ = fVar93 * fVar95;
      auVar56._0_4_ = fVar243 * fVar211;
      auVar56._4_4_ = fVar151 * fVar218;
      auVar56._8_4_ = fVar170 * fVar220;
      auVar56._12_4_ = fVar177 * fVar221;
      auVar135 = vsubps_avx(auVar56,auVar80);
      auVar57._0_4_ = fVar14 * auVar64._0_4_ + auVar135._0_4_ * fVar94 + fVar228 * auVar54._0_4_;
      auVar57._4_4_ = fVar15 * auVar64._4_4_ + auVar135._4_4_ * fVar194 + fVar230 * auVar54._4_4_;
      auVar57._8_4_ = fVar16 * auVar64._8_4_ + auVar135._8_4_ * fVar195 + fVar235 * auVar54._8_4_;
      auVar57._12_4_ =
           fVar169 * auVar64._12_4_ + auVar135._12_4_ * fVar208 + fVar237 * auVar54._12_4_;
      auVar223._0_4_ = auVar57._0_4_ + fVar198 + auVar175._0_4_;
      auVar223._4_4_ = auVar57._4_4_ + fVar206 + auVar175._4_4_;
      auVar223._8_4_ = auVar57._8_4_ + auVar203._8_4_ + auVar175._8_4_;
      auVar223._12_4_ = auVar57._12_4_ + auVar203._12_4_ + auVar175._12_4_;
      auVar64 = vandps_avx(auVar223,auVar146);
      auVar81._0_4_ = auVar64._0_4_ * 1.1920929e-07;
      auVar81._4_4_ = auVar64._4_4_ * 1.1920929e-07;
      auVar81._8_4_ = auVar64._8_4_ * 1.1920929e-07;
      auVar81._12_4_ = auVar64._12_4_ * 1.1920929e-07;
      auVar64 = vminps_avx(auVar203,auVar175);
      auVar64 = vminps_avx(auVar64,auVar57);
      uVar35 = CONCAT44(auVar81._4_4_,auVar81._0_4_);
      auVar116._0_8_ = uVar35 ^ 0x8000000080000000;
      auVar116._8_4_ = -auVar81._8_4_;
      auVar116._12_4_ = -auVar81._12_4_;
      auVar64 = vcmpps_avx(auVar64,auVar116,5);
      auVar54 = vmaxps_avx(auVar203,auVar175);
      auVar54 = vmaxps_avx(auVar54,auVar57);
      auVar54 = vcmpps_avx(auVar54,auVar81,2);
      auVar64 = vorps_avx(auVar64,auVar54);
      auVar54 = auVar46 & auVar64;
      auVar64 = vandps_avx(auVar64,auVar46);
      if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar54 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar54 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar54[0xf])
      {
        auVar62 = vpcmpeqd_avx(auVar62,auVar62);
        auVar54 = ZEXT416(0) << 0x20;
      }
      else {
        auVar58._0_4_ = fVar167 * fVar89;
        auVar58._4_4_ = fVar38 * fVar11;
        auVar58._8_4_ = fVar197 * fVar67;
        auVar58._12_4_ = fVar210 * fVar166;
        auVar82._0_4_ = fVar224 * fVar124;
        auVar82._4_4_ = fVar229 * fVar125;
        auVar82._8_4_ = fVar231 * fVar136;
        auVar82._12_4_ = fVar236 * fVar149;
        auVar135 = vsubps_avx(auVar82,auVar58);
        auVar103._0_4_ = fVar179 * fVar124;
        auVar103._4_4_ = fVar88 * fVar125;
        auVar103._8_4_ = fVar91 * fVar136;
        auVar103._12_4_ = fVar93 * fVar149;
        auVar117._0_4_ = fVar167 * fVar193;
        auVar117._4_4_ = fVar38 * fVar66;
        auVar117._8_4_ = fVar197 * fVar205;
        auVar117._12_4_ = fVar210 * fVar168;
        auVar131 = vsubps_avx(auVar117,auVar103);
        auVar62 = vandps_avx(auVar58,auVar146);
        auVar54 = vandps_avx(auVar103,auVar146);
        auVar62 = vcmpps_avx(auVar62,auVar54,1);
        auVar135 = vblendvps_avx(auVar131,auVar135,auVar62);
        auVar59._0_4_ = fVar152 * fVar193;
        auVar59._4_4_ = fVar204 * fVar66;
        auVar59._8_4_ = fVar209 * fVar205;
        auVar59._12_4_ = fVar219 * fVar168;
        auVar83._0_4_ = fVar152 * fVar89;
        auVar83._4_4_ = fVar204 * fVar11;
        auVar83._8_4_ = fVar209 * fVar67;
        auVar83._12_4_ = fVar219 * fVar166;
        auVar104._0_4_ = fVar124 * fVar192;
        auVar104._4_4_ = fVar125 * fVar181;
        auVar104._8_4_ = fVar136 * fVar153;
        auVar104._12_4_ = fVar149 * fVar13;
        auVar131 = vsubps_avx(auVar83,auVar104);
        auVar128._0_4_ = fVar243 * fVar124;
        auVar128._4_4_ = fVar151 * fVar125;
        auVar128._8_4_ = fVar170 * fVar136;
        auVar128._12_4_ = fVar177 * fVar149;
        auVar55 = vsubps_avx(auVar128,auVar59);
        auVar62 = vandps_avx(auVar104,auVar146);
        auVar54 = vandps_avx(auVar59,auVar146);
        auVar62 = vcmpps_avx(auVar62,auVar54,1);
        auVar131 = vblendvps_avx(auVar55,auVar131,auVar62);
        auVar60._0_4_ = fVar243 * fVar167;
        auVar60._4_4_ = fVar151 * fVar38;
        auVar60._8_4_ = fVar170 * fVar197;
        auVar60._12_4_ = fVar177 * fVar210;
        auVar105._0_4_ = fVar167 * fVar192;
        auVar105._4_4_ = fVar38 * fVar181;
        auVar105._8_4_ = fVar197 * fVar153;
        auVar105._12_4_ = fVar210 * fVar13;
        auVar129._0_4_ = fVar152 * fVar224;
        auVar129._4_4_ = fVar204 * fVar229;
        auVar129._8_4_ = fVar209 * fVar231;
        auVar129._12_4_ = fVar219 * fVar236;
        auVar147._0_4_ = fVar152 * fVar179;
        auVar147._4_4_ = fVar204 * fVar88;
        auVar147._8_4_ = fVar209 * fVar91;
        auVar147._12_4_ = fVar219 * fVar93;
        auVar55 = vsubps_avx(auVar105,auVar129);
        auVar63 = vsubps_avx(auVar147,auVar60);
        auVar62 = vandps_avx(auVar146,auVar129);
        auVar54 = vandps_avx(auVar146,auVar60);
        auVar62 = vcmpps_avx(auVar62,auVar54,1);
        auVar55 = vblendvps_avx(auVar63,auVar55,auVar62);
        local_1b18 = auVar20._0_4_;
        fStack_1b14 = auVar20._4_4_;
        fStack_1b10 = auVar20._8_4_;
        fVar89 = auVar135._0_4_ * local_1b18 + auVar55._0_4_ * fVar94 + auVar131._0_4_ * fVar228;
        fVar192 = auVar135._4_4_ * fStack_1b14 + auVar55._4_4_ * fVar194 + auVar131._4_4_ * fVar230;
        fVar94 = auVar135._8_4_ * fStack_1b10 + auVar55._8_4_ * fVar195 + auVar131._8_4_ * fVar235;
        fVar167 = auVar135._12_4_ * fVar169 + auVar55._12_4_ * fVar208 + auVar131._12_4_ * fVar237;
        auVar61._0_4_ = fVar89 + fVar89;
        auVar61._4_4_ = fVar192 + fVar192;
        auVar61._8_4_ = fVar94 + fVar94;
        auVar61._12_4_ = fVar167 + fVar167;
        fVar89 = auVar135._0_4_ * fVar8 + auVar55._0_4_ * fVar238 + auVar131._0_4_ * fVar150;
        fVar192 = auVar135._4_4_ * fVar9 + auVar55._4_4_ * fVar244 + auVar131._4_4_ * fVar196;
        fVar94 = auVar135._8_4_ * fVar180 + auVar55._8_4_ * fVar245 + auVar131._8_4_ * fVar207;
        fVar167 = auVar135._12_4_ * fVar10 + auVar55._12_4_ * fVar246 + auVar131._12_4_ * fVar212;
        auVar62 = vrcpps_avx(auVar61);
        fVar8 = auVar62._0_4_;
        auVar176._0_4_ = auVar61._0_4_ * fVar8;
        fVar9 = auVar62._4_4_;
        auVar176._4_4_ = auVar61._4_4_ * fVar9;
        fVar180 = auVar62._8_4_;
        auVar176._8_4_ = auVar61._8_4_ * fVar180;
        fVar10 = auVar62._12_4_;
        auVar176._12_4_ = auVar61._12_4_ * fVar10;
        auVar191._8_4_ = 0x3f800000;
        auVar191._0_8_ = &DAT_3f8000003f800000;
        auVar191._12_4_ = 0x3f800000;
        auVar62 = vsubps_avx(auVar191,auVar176);
        auVar106._0_4_ = (fVar89 + fVar89) * (fVar8 + fVar8 * auVar62._0_4_);
        auVar106._4_4_ = (fVar192 + fVar192) * (fVar9 + fVar9 * auVar62._4_4_);
        auVar106._8_4_ = (fVar94 + fVar94) * (fVar180 + fVar180 * auVar62._8_4_);
        auVar106._12_4_ = (fVar167 + fVar167) * (fVar10 + fVar10 * auVar62._12_4_);
        auVar62 = vcmpps_avx(auVar106,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar54 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar106,2);
        auVar62 = vandps_avx(auVar54,auVar62);
        auVar54 = ZEXT816(0) << 0x20;
        auVar63 = vcmpps_avx(auVar61,auVar54,4);
        auVar62 = vandps_avx(auVar63,auVar62);
        auVar62 = vpslld_avx(auVar62,0x1f);
        auVar63 = vpsrad_avx(auVar62,0x1f);
        auVar62 = auVar64 & auVar63;
        auVar64 = vandps_avx(auVar64,auVar63);
        if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar62[0xf] < '\0') {
          uStack_1b30 = auVar203._8_8_;
          uStack_17b0 = uStack_1b30;
          local_1818 = auVar55;
          local_1808 = auVar131;
          local_17f8 = auVar135;
          local_17e8 = auVar106;
          local_17d8 = auVar223;
          _local_17c8 = auVar175;
          local_17b8 = auVar203._0_8_;
        }
        auVar62 = vpcmpeqd_avx(auVar148,auVar148);
      }
      auVar242 = ZEXT1664(auVar62);
      auVar234 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar227 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar217 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      pGVar6 = (context->scene->geometries).items[(pre.super_Precalculations.grid)->_geomID].ptr;
      uVar4 = pGVar6->mask;
      auVar84._4_4_ = uVar4;
      auVar84._0_4_ = uVar4;
      auVar84._8_4_ = uVar4;
      auVar84._12_4_ = uVar4;
      auVar135 = vandps_avx(auVar84,*(undefined1 (*) [16])(ray + 0x90));
      auVar135 = vpcmpeqd_avx(auVar135,auVar54);
      auVar148 = auVar64 & ~auVar135;
      if ((((auVar148 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar148 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar148 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          auVar148[0xf] < '\0') {
        auVar64 = vandnps_avx(auVar135,auVar64);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar135 = vandps_avx(local_17d8,auVar146);
          auVar148 = vrcpps_avx(local_17d8);
          fVar8 = auVar148._0_4_;
          auVar121._0_4_ = local_17d8._0_4_ * fVar8;
          fVar9 = auVar148._4_4_;
          auVar121._4_4_ = local_17d8._4_4_ * fVar9;
          fVar180 = auVar148._8_4_;
          auVar121._8_4_ = local_17d8._8_4_ * fVar180;
          fVar10 = auVar148._12_4_;
          auVar121._12_4_ = local_17d8._12_4_ * fVar10;
          auVar165._8_4_ = 0x3f800000;
          auVar165._0_8_ = &DAT_3f8000003f800000;
          auVar165._12_4_ = 0x3f800000;
          auVar148 = vsubps_avx(auVar165,auVar121);
          auVar110._0_4_ = fVar8 + fVar8 * auVar148._0_4_;
          auVar110._4_4_ = fVar9 + fVar9 * auVar148._4_4_;
          auVar110._8_4_ = fVar180 + fVar180 * auVar148._8_4_;
          auVar110._12_4_ = fVar10 + fVar10 * auVar148._12_4_;
          auVar122._8_4_ = 0x219392ef;
          auVar122._0_8_ = 0x219392ef219392ef;
          auVar122._12_4_ = 0x219392ef;
          auVar135 = vcmpps_avx(auVar135,auVar122,5);
          auVar135 = vandps_avx(auVar135,auVar110);
          auVar86._0_4_ = auVar135._0_4_ * (float)local_17b8;
          auVar86._4_4_ = auVar135._4_4_ * local_17b8._4_4_;
          auVar86._8_4_ = auVar135._8_4_ * (float)uStack_17b0;
          auVar86._12_4_ = auVar135._12_4_ * uStack_17b0._4_4_;
          auVar199 = vminps_avx(auVar86,auVar165);
          auVar111._0_4_ = auVar135._0_4_ * (float)local_17c8._0_4_;
          auVar111._4_4_ = auVar135._4_4_ * (float)local_17c8._4_4_;
          auVar111._8_4_ = auVar135._8_4_ * fStack_17c0;
          auVar111._12_4_ = auVar135._12_4_ * fStack_17bc;
          auVar222 = vminps_avx(auVar111,auVar165);
          uVar26 = *(undefined4 *)(local_1ad8 + lVar30);
          auVar123._4_4_ = uVar26;
          auVar123._0_4_ = uVar26;
          auVar123._8_4_ = uVar26;
          auVar123._12_4_ = uVar26;
          uVar26 = *(undefined4 *)(local_1ad8 + lVar30 + 4);
          auVar133._4_4_ = uVar26;
          auVar133._0_4_ = uVar26;
          auVar133._8_4_ = uVar26;
          auVar133._12_4_ = uVar26;
          auVar148 = vpsrld_avx(auVar123,0x10);
          auVar135 = vpblendw_avx(auVar123,auVar54,0xaa);
          auVar135 = vcvtdq2ps_avx(auVar135);
          auVar148 = vcvtdq2ps_avx(auVar148);
          auVar131 = vsubps_avx(auVar165,auVar199);
          auVar225 = vsubps_avx(auVar131,auVar222);
          auVar131 = vpblendw_avx(auVar133,auVar54,0xaa);
          auVar131 = vcvtdq2ps_avx(auVar131);
          auVar55 = vpsrld_avx(auVar133,0x10);
          auVar55 = vcvtdq2ps_avx(auVar55);
          uVar26 = *(undefined4 *)(local_1b00 + lVar30);
          auVar134._4_4_ = uVar26;
          auVar134._0_4_ = uVar26;
          auVar134._8_4_ = uVar26;
          auVar134._12_4_ = uVar26;
          auVar63 = vpblendw_avx(auVar134,auVar54,0xaa);
          auVar63 = vcvtdq2ps_avx(auVar63);
          local_1978 = auVar199._0_4_ * auVar63._0_4_ * 0.00012207031 +
                       auVar225._0_4_ * auVar135._0_4_ * 0.00012207031 +
                       auVar222._0_4_ * auVar131._0_4_ * 0.00012207031;
          fStack_1974 = auVar199._4_4_ * auVar63._4_4_ * 0.00012207031 +
                        auVar225._4_4_ * auVar135._4_4_ * 0.00012207031 +
                        auVar222._4_4_ * auVar131._4_4_ * 0.00012207031;
          fStack_1970 = auVar199._8_4_ * auVar63._8_4_ * 0.00012207031 +
                        auVar225._8_4_ * auVar135._8_4_ * 0.00012207031 +
                        auVar222._8_4_ * auVar131._8_4_ * 0.00012207031;
          fStack_196c = auVar199._12_4_ * auVar63._12_4_ * 0.00012207031 +
                        auVar225._12_4_ * auVar135._12_4_ * 0.00012207031 +
                        auVar222._12_4_ * auVar131._12_4_ * 0.00012207031;
          auVar135 = vpsrld_avx(auVar134,0x10);
          auVar135 = vcvtdq2ps_avx(auVar135);
          local_1968 = auVar199._0_4_ * auVar135._0_4_ * 0.00012207031 +
                       auVar225._0_4_ * auVar148._0_4_ * 0.00012207031 +
                       auVar222._0_4_ * auVar55._0_4_ * 0.00012207031;
          fStack_1964 = auVar199._4_4_ * auVar135._4_4_ * 0.00012207031 +
                        auVar225._4_4_ * auVar148._4_4_ * 0.00012207031 +
                        auVar222._4_4_ * auVar55._4_4_ * 0.00012207031;
          fStack_1960 = auVar199._8_4_ * auVar135._8_4_ * 0.00012207031 +
                        auVar225._8_4_ * auVar148._8_4_ * 0.00012207031 +
                        auVar222._8_4_ * auVar55._8_4_ * 0.00012207031;
          fStack_195c = auVar199._12_4_ * auVar135._12_4_ * 0.00012207031 +
                        auVar225._12_4_ * auVar148._12_4_ * 0.00012207031 +
                        auVar222._12_4_ * auVar55._12_4_ * 0.00012207031;
          local_19a8 = local_17f8._0_8_;
          uStack_19a0 = local_17f8._8_8_;
          local_1998 = local_1808._0_8_;
          uStack_1990 = local_1808._8_8_;
          local_1988 = local_1818._0_8_;
          uStack_1980 = local_1818._8_8_;
          local_1948 = vpshufd_avx(ZEXT416((pre.super_Precalculations.grid)->_geomID),0);
          local_1958 = vpshufd_avx(ZEXT416((pre.super_Precalculations.grid)->_primID),0);
          vcmpps_avx(ZEXT1632(local_1958),ZEXT1632(local_1958),0xf);
          uStack_1934 = context->user->instID[0];
          local_1938 = uStack_1934;
          uStack_1930 = uStack_1934;
          uStack_192c = uStack_1934;
          uStack_1928 = context->user->instPrimID[0];
          uStack_1924 = uStack_1928;
          uStack_1920 = uStack_1928;
          uStack_191c = uStack_1928;
          auVar135 = *(undefined1 (*) [16])(ray + 0x80);
          auVar148 = vblendvps_avx(auVar135,local_17e8,auVar64);
          *(undefined1 (*) [16])(ray + 0x80) = auVar148;
          args.valid = (int *)local_1af8;
          args.geometryUserPtr = pGVar6->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_19a8;
          args.N = 4;
          local_1af8 = auVar64;
          args.ray = (RTCRayN *)ray;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar6->occlusionFilterN)(&args);
            auVar54 = ZEXT816(0) << 0x40;
            auVar234 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            auVar217 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
            auVar227 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (local_1af8 == (undefined1  [16])0x0) {
            auVar64 = vpcmpeqd_avx((undefined1  [16])0x0,auVar54);
            auVar62 = vpcmpeqd_avx(auVar62,auVar62);
            auVar242 = ZEXT1664(auVar62);
            auVar62 = auVar62 ^ auVar64;
          }
          else {
            p_Var7 = context->args->filter;
            auVar62 = vpcmpeqd_avx(auVar62,auVar62);
            auVar242 = ZEXT1664(auVar62);
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var7)(&args);
              auVar54 = ZEXT816(0) << 0x40;
              auVar62 = vpcmpeqd_avx(auVar62,auVar62);
              auVar242 = ZEXT1664(auVar62);
              auVar234 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar217 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar227 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            auVar64 = vpcmpeqd_avx(auVar54,local_1af8);
            auVar62 = auVar242._0_16_ ^ auVar64;
            auVar112._8_4_ = 0xff800000;
            auVar112._0_8_ = 0xff800000ff800000;
            auVar112._12_4_ = 0xff800000;
            auVar64 = vblendvps_avx(auVar112,*(undefined1 (*) [16])(args.ray + 0x80),auVar64);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar64;
          }
          auVar62 = vpslld_avx(auVar62,0x1f);
          auVar64 = vpsrad_avx(auVar62,0x1f);
          auVar62 = vblendvps_avx(auVar135,*(undefined1 (*) [16])pRVar1,auVar62);
          *(undefined1 (*) [16])pRVar1 = auVar62;
        }
        auVar46 = vpandn_avx(auVar64,auVar46);
      }
      auVar248 = ZEXT1664(auVar46);
      lVar30 = lVar30 + 4;
    } while ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar46[0xf] < '\0');
    if (uVar24 == 2) break;
  }
  sVar28 = 0;
  auVar62 = auVar248._0_16_ ^ auVar242._0_16_;
LAB_003307b7:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx(auVar62,(undefined1  [16])terminated.field_0);
  auVar62 = auVar242._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar62 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar62 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar62[0xf]) {
LAB_0033081c:
    iVar25 = 3;
  }
  else {
    auVar113._8_4_ = 0xff800000;
    auVar113._0_8_ = 0xff800000ff800000;
    auVar113._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar113,
                       (undefined1  [16])terminated.field_0);
    iVar25 = 0;
    if (sVar28 != 0) {
      pNVar36->ptr = sVar28;
      pNVar36 = pNVar36 + 1;
      aVar65.i[2] = 0xff800000;
      aVar65._0_8_ = 0xff800000ff800000;
      aVar65.i[3] = 0xff800000;
      *paVar33 = aVar65;
      paVar33 = paVar33 + 1;
    }
  }
LAB_0033081f:
  if (iVar25 == 3) {
    auVar12 = vandps_avx(auVar87,(undefined1  [16])terminated.field_0);
    auVar87._8_4_ = 0xff800000;
    auVar87._0_8_ = 0xff800000ff800000;
    auVar87._12_4_ = 0xff800000;
    auVar12 = vmaskmovps_avx(auVar12,auVar87);
    *(undefined1 (*) [16])pRVar1 = auVar12;
    return;
  }
  goto LAB_0032f28c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }